

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O1

ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
* getMemBufferCopyImpl
            (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
             *__return_storage_ptr__,StringRef InputData,Twine *BufferName)

{
  _func_int **in_RAX;
  undefined8 uVar1;
  pointer *__ptr;
  unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_> Buf;
  _func_int **local_28;
  
  local_28 = in_RAX;
  llvm::WritableMemoryBuffer::getNewUninitMemBuffer
            ((WritableMemoryBuffer *)&local_28,InputData.Length,BufferName);
  if (local_28 == (_func_int **)0x0) {
    uVar1 = std::_V2::generic_category();
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
    *(undefined4 *)&__return_storage_ptr__->field_0 = 0xc;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = uVar1;
  }
  else {
    memcpy(local_28[1],InputData.Data,InputData.Length);
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 & 0xfe;
    *(_func_int ***)&__return_storage_ptr__->field_0 = local_28;
    local_28 = (_func_int **)0x0;
  }
  if (local_28 != (_func_int **)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorOr<std::unique_ptr<WritableMemoryBuffer>>
getMemBufferCopyImpl(StringRef InputData, const Twine &BufferName) {
  auto Buf = WritableMemoryBuffer::getNewUninitMemBuffer(InputData.size(), BufferName);
  if (!Buf)
    return make_error_code(errc::not_enough_memory);
  memcpy(Buf->getBufferStart(), InputData.data(), InputData.size());
  return std::move(Buf);
}